

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void SimpleLoggerMgr::flushWorker(void)

{
  int iVar1;
  EVP_PKEY_CTX *ctx;
  undefined4 extraout_var;
  ostream *poVar2;
  atomic<SimpleLoggerMgr_*> this;
  
  ctx = (EVP_PKEY_CTX *)pthread_self();
  pthread_setname_np((pthread_t)ctx,"sl_flusher");
  this = instance;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar1 = init(ctx);
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar1);
  }
  while( true ) {
    do {
      if (((((__pointer_type)this._M_b._M_p)->termination)._M_base._M_i & 1U) != 0) {
        return;
      }
      sleepFlusher((SimpleLoggerMgr *)this._M_b._M_p,500);
      flushAllLoggers((SimpleLoggerMgr *)this._M_b._M_p);
    } while ((((__pointer_type)this._M_b._M_p)->abortTimer).super___atomic_base<unsigned_long>._M_i
             == 0);
    if ((((__pointer_type)this._M_b._M_p)->abortTimer).super___atomic_base<unsigned_long>._M_i <
        0x1f5) break;
    LOCK();
    (((__pointer_type)this._M_b._M_p)->abortTimer).super___atomic_base<unsigned_long>._M_i =
         (((__pointer_type)this._M_b._M_p)->abortTimer).super___atomic_base<unsigned_long>._M_i -
         500;
    UNLOCK();
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"STACK DUMP TIMEOUT, FORCE ABORT");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::flushWorker() {
#ifdef __linux__
    pthread_setname_np(pthread_self(), "sl_flusher");
#endif
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    while (!mgr->chkTermination()) {
        // Every 500ms.
        size_t sub_ms = 500;
        mgr->sleepFlusher(sub_ms);
        mgr->flushAllLoggers();
        if (mgr->abortTimer) {
            if (mgr->abortTimer > sub_ms) {
                mgr->abortTimer.fetch_sub(sub_ms);
            } else {
                std::cerr << "STACK DUMP TIMEOUT, FORCE ABORT" << std::endl;
                exit(-1);
            }
        }
    }
}